

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::LineNumSamplesCase::renderPattern(LineNumSamplesCase *this)

{
  float fVar1;
  float fVar2;
  Vector<float,_4> local_3c;
  Vector<float,_2> local_2c;
  Vector<float,_2> local_24;
  float local_1c;
  int local_18;
  float angle;
  int i;
  int numLines;
  LineNumSamplesCase *this_local;
  
  _i = this;
  fVar1 = ::deFloatSqrt((float)(this->super_NumSamplesCase).super_MultisampleCase.m_viewportSize /
                        256.0);
  angle = (float)(int)(fVar1 * 100.0);
  for (local_18 = 0; local_18 < (int)angle; local_18 = local_18 + 1) {
    local_1c = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
               ((float)local_18 * 6.2831855) / (float)(int)angle;
    tcu::Vector<float,_2>::Vector(&local_24,0.0,0.0);
    fVar1 = ::deFloatCos(local_1c);
    fVar2 = ::deFloatSin(local_1c);
    tcu::Vector<float,_2>::Vector(&local_2c,fVar1 * 0.95,fVar2 * 0.95);
    tcu::Vector<float,_4>::Vector(&local_3c,1.0);
    MultisampleCase::renderLine((MultisampleCase *)this,&local_24,&local_2c,&local_3c);
  }
  return;
}

Assistant:

void LineNumSamplesCase::renderPattern (void) const
{
	// The test pattern consists of several lines at different angles.

	// We scale the number of lines based on the viewport size. This is because a gl line's thickness is
	// constant in pixel units, i.e. they get relatively thicker as viewport size decreases. Thus we must
	// decrease the number of lines in order to decrease the extent of overlap among the lines in the
	// center of the pattern.
	const int numLines = (int)(100.0f * deFloatSqrt((float)m_viewportSize / 256.0f));

	for (int i = 0; i < numLines; i++)
	{
		float angle = 2.0f*DE_PI * (float)i / (float)numLines + 0.001f*(float)m_currentIteration;
		renderLine(Vec2(0.0f, 0.0f), Vec2(deFloatCos(angle)*0.95f, deFloatSin(angle)*0.95f), Vec4(1.0f));
	}
}